

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall CServer::SendMap(CServer *this,int ClientID)

{
  char *pStr;
  undefined4 in_ESI;
  CPacker *in_RDI;
  long in_FS_OFFSET;
  CMsgPacker Msg;
  bool in_stack_fffffffffffff7bb;
  int in_stack_fffffffffffff7bc;
  undefined4 in_stack_fffffffffffff7d0;
  CPacker local_820;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CMsgPacker::CMsgPacker((CMsgPacker *)in_RDI,in_stack_fffffffffffff7bc,in_stack_fffffffffffff7bb);
  pStr = GetMapName((CServer *)CONCAT44(in_ESI,in_stack_fffffffffffff7d0));
  CPacker::AddString(&local_820,pStr,0);
  CPacker::AddInt(in_RDI,in_stack_fffffffffffff7bc);
  CPacker::AddInt(in_RDI,in_stack_fffffffffffff7bc);
  CPacker::AddInt(in_RDI,in_stack_fffffffffffff7bc);
  CPacker::AddInt(in_RDI,in_stack_fffffffffffff7bc);
  CPacker::AddRaw(&local_820,in_RDI[0x1248].m_aBuffer + 0x440,0x20);
  (**(code **)(*(long *)in_RDI->m_aBuffer + 0x48))(in_RDI,&local_820,3,in_ESI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CServer::SendMap(int ClientID)
{
	CMsgPacker Msg(NETMSG_MAP_CHANGE, true);
	Msg.AddString(GetMapName(), 0);
	Msg.AddInt(m_CurrentMapCrc);
	Msg.AddInt(m_CurrentMapSize);
	Msg.AddInt(m_MapChunksPerRequest);
	Msg.AddInt(MAP_CHUNK_SIZE);
	Msg.AddRaw(&m_CurrentMapSha256, sizeof(m_CurrentMapSha256));
	SendMsg(&Msg, MSGFLAG_VITAL|MSGFLAG_FLUSH, ClientID);
}